

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AmstradCPC.cpp
# Opt level: O2

void __thiscall
AmstradCPC::CRTCBusHandler::perform_bus_cycle_phase1(CRTCBusHandler *this,BusState *state)

{
  uint8_t *puVar1;
  unsigned_long *puVar2;
  unsigned_long *puVar3;
  unsigned_short uVar4;
  ulong uVar5;
  byte bVar6;
  int iVar7;
  OutputMode OVar8;
  bool bVar9;
  long lStack_30;
  
  bVar6 = 0;
  iVar7 = this->cycles_into_hsync_ + 1;
  if (state->hsync == false) {
    iVar7 = 0;
  }
  this->cycles_into_hsync_ = iVar7;
  OVar8 = Sync;
  if ((3 < iVar7 - 2U) && (bVar6 = 0, state->vsync == false)) {
    bVar9 = iVar7 - 7U < 4;
    OVar8 = (state->display_enable & 1) + Border;
    if (bVar9 || (state->hsync & 1U) != 0) {
      OVar8 = bVar9 + Blank;
    }
    bVar6 = ((bVar9 | state->hsync) ^ 1U) & state->display_enable;
  }
  iVar7 = this->cycles_;
  if (OVar8 == this->previous_output_mode_) {
    iVar7 = iVar7 + 1;
  }
  else {
    if (iVar7 != 0) {
      switch(this->previous_output_mode_) {
      case Sync:
        Outputs::CRT::CRT::output_sync(&this->crt_,iVar7 << 4);
        break;
      default:
        Outputs::CRT::CRT::output_blank(&this->crt_,iVar7 << 4);
        break;
      case ColourBurst:
        Outputs::CRT::CRT::output_default_colour_burst(&this->crt_,iVar7 << 4,')');
        break;
      case Border:
        output_border(this,iVar7);
        break;
      case Pixels:
        Outputs::CRT::CRT::output_data
                  (&this->crt_,iVar7 << 4,(long)((iVar7 << 4) / this->pixel_divider_));
        this->pixel_data_ = (uint8_t *)0x0;
        this->pixel_pointer_ = (uint8_t *)0x0;
      }
    }
    this->previous_output_mode_ = OVar8;
    iVar7 = 1;
  }
  this->cycles_ = iVar7;
  if ((bVar6 & 1) == 0) {
    return;
  }
  puVar2 = (unsigned_long *)this->pixel_data_;
  if (puVar2 == (unsigned_long *)0x0) {
    puVar2 = (unsigned_long *)Outputs::CRT::CRT::begin_data(&this->crt_,0x140,8);
    this->pixel_data_ = (uint8_t *)puVar2;
    this->pixel_pointer_ = (uint8_t *)puVar2;
    puVar3 = puVar2;
  }
  else {
    puVar3 = (unsigned_long *)this->pixel_pointer_;
  }
  if (puVar3 == (unsigned_long *)0x0) {
    return;
  }
  if (3 < (uint)this->mode_) goto LAB_0024d780;
  uVar5 = (ulong)((state->refresh_address & 0x3ff) * 2 + (state->refresh_address & 0x3000) * 4 |
                 (state->row_address & 7) << 0xb);
  switch(this->mode_) {
  case 0:
    puVar1 = this->ram_;
    *(unsigned_short *)puVar3 = (this->mode0_output_)._M_elems[puVar1[uVar5]];
    uVar4 = (this->mode0_output_)._M_elems[puVar1[(uVar5 & 0xffff) + 1]];
    goto LAB_0024d745;
  case 1:
    puVar1 = this->ram_;
    *(uint *)puVar3 = (this->mode1_output_)._M_elems[puVar1[uVar5]];
    *(uint *)((long)puVar3 + 4) = (this->mode1_output_)._M_elems[puVar1[(uVar5 & 0xffff) + 1]];
    lStack_30 = 8;
    break;
  case 2:
    puVar1 = this->ram_;
    *puVar3 = (this->mode2_output_)._M_elems[puVar1[uVar5]];
    puVar3[1] = (this->mode2_output_)._M_elems[puVar1[(uVar5 & 0xffff) + 1]];
    lStack_30 = 0x10;
    break;
  case 3:
    puVar1 = this->ram_;
    *(unsigned_short *)puVar3 = (this->mode3_output_)._M_elems[puVar1[uVar5]];
    uVar4 = (this->mode3_output_)._M_elems[puVar1[(uVar5 & 0xffff) + 1]];
LAB_0024d745:
    *(unsigned_short *)((long)puVar3 + 2) = uVar4;
    lStack_30 = 4;
  }
  puVar3 = (unsigned_long *)((long)puVar3 + lStack_30);
  this->pixel_pointer_ = (uint8_t *)puVar3;
LAB_0024d780:
  if (puVar3 == puVar2 + 0x28) {
    iVar7 = this->cycles_ << 4;
    Outputs::CRT::CRT::output_data(&this->crt_,iVar7,(long)(iVar7 / this->pixel_divider_));
    this->cycles_ = 0;
    this->pixel_data_ = (uint8_t *)0x0;
    this->pixel_pointer_ = (uint8_t *)0x0;
  }
  return;
}

Assistant:

forceinline void perform_bus_cycle_phase1(const Motorola::CRTC::BusState &state) {
			// The gate array waits 2us to react to the CRTC's vsync signal, and then
			// caps output at 4us. Since the clock rate is 1Mhz, that's 2 and 4 cycles,
			// respectively.
			if(state.hsync) {
				cycles_into_hsync_++;
			} else {
				cycles_into_hsync_ = 0;
			}

			const bool is_hsync = (cycles_into_hsync_ >= 2 && cycles_into_hsync_ < 6);
			const bool is_colour_burst = (cycles_into_hsync_ >= 7 && cycles_into_hsync_ < 11);

			// Sync is taken to override pixels, and is combined as a simple OR.
			const bool is_sync = is_hsync || state.vsync;
			const bool is_blank = !is_sync && state.hsync;

			OutputMode output_mode;
			if(is_sync) {
				output_mode = OutputMode::Sync;
			} else if(is_colour_burst) {
				output_mode = OutputMode::ColourBurst;
			} else if(is_blank) {
				output_mode = OutputMode::Blank;
			} else if(state.display_enable) {
				output_mode = OutputMode::Pixels;
			} else {
				output_mode = OutputMode::Border;
			}

			// If a transition between sync/border/pixels just occurred, flush whatever was
			// in progress to the CRT and reset counting.
			if(output_mode != previous_output_mode_) {
				if(cycles_) {
					switch(previous_output_mode_) {
						default:
						case OutputMode::Blank:			crt_.output_blank(cycles_ * 16);				break;
						case OutputMode::Sync:			crt_.output_sync(cycles_ * 16);					break;
						case OutputMode::Border:		output_border(cycles_);							break;
						case OutputMode::ColourBurst:	crt_.output_default_colour_burst(cycles_ * 16);	break;
						case OutputMode::Pixels:
							crt_.output_data(cycles_ * 16, size_t(cycles_ * 16 / pixel_divider_));
							pixel_pointer_ = pixel_data_ = nullptr;
						break;
					}
				}

				cycles_ = 0;
				previous_output_mode_ = output_mode;
			}

			// increment cycles since state changed
			cycles_++;

			// collect some more pixels if output is ongoing
			if(previous_output_mode_ == OutputMode::Pixels) {
				if(!pixel_data_) {
					pixel_pointer_ = pixel_data_ = crt_.begin_data(320, 8);
				}
				if(pixel_pointer_) {
					// the CPC shuffles output lines as:
					//	MA13 MA12	RA2 RA1 RA0		MA9 MA8 MA7 MA6 MA5 MA4 MA3 MA2 MA1 MA0		CCLK
					// ... so form the real access address.
					const uint16_t address =
						uint16_t(
							((state.refresh_address & 0x3ff) << 1) |
							((state.row_address & 0x7) << 11) |
							((state.refresh_address & 0x3000) << 2)
						);

					// Fetch two bytes and translate into pixels. Guaranteed: the mode can change only at
					// hsync, so there's no risk of pixel_pointer_ overrunning 320 output pixels without
					// exactly reaching 320 output pixels.
					switch(mode_) {
						case 0:
							reinterpret_cast<uint16_t *>(pixel_pointer_)[0] = mode0_output_[ram_[address]];
							reinterpret_cast<uint16_t *>(pixel_pointer_)[1] = mode0_output_[ram_[address+1]];
							pixel_pointer_ += 2 * sizeof(uint16_t);
						break;

						case 1:
							reinterpret_cast<uint32_t *>(pixel_pointer_)[0] = mode1_output_[ram_[address]];
							reinterpret_cast<uint32_t *>(pixel_pointer_)[1] = mode1_output_[ram_[address+1]];
							pixel_pointer_ += 2 * sizeof(uint32_t);
						break;

						case 2:
							reinterpret_cast<uint64_t *>(pixel_pointer_)[0] = mode2_output_[ram_[address]];
							reinterpret_cast<uint64_t *>(pixel_pointer_)[1] = mode2_output_[ram_[address+1]];
							pixel_pointer_ += 2 * sizeof(uint64_t);
						break;

						case 3:
							reinterpret_cast<uint16_t *>(pixel_pointer_)[0] = mode3_output_[ram_[address]];
							reinterpret_cast<uint16_t *>(pixel_pointer_)[1] = mode3_output_[ram_[address+1]];
							pixel_pointer_ += 2 * sizeof(uint16_t);
						break;

					}

					// Flush the current buffer pixel if full; the CRTC allows many different display
					// widths so it's not necessarily possible to predict the correct number in advance
					// and using the upper bound could lead to inefficient behaviour.
					if(pixel_pointer_ == pixel_data_ + 320) {
						crt_.output_data(cycles_ * 16, size_t(cycles_ * 16 / pixel_divider_));
						pixel_pointer_ = pixel_data_ = nullptr;
						cycles_ = 0;
					}
				}
			}
		}